

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpectralTransform.cpp
# Opt level: O1

TPZAutoPointer<TPZMatrix<double>_> __thiscall
TPZSTShiftOrigin<double>::CalcMatrix
          (TPZSTShiftOrigin<double> *this,TPZAutoPointer<TPZMatrix<double>_> *A,
          TPZAutoPointer<TPZMatrix<double>_> *B)

{
  atomic_int *paVar1;
  TPZReference *pTVar2;
  TPZSpectralTransform<double> TVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  int iVar7;
  undefined8 *in_RCX;
  long lVar8;
  double local_30;
  
  iVar7 = (**(code **)(**(long **)*in_RCX + 0x80))();
  (**(code **)((ulong)(iVar7 != 0) * 0x20 + 0xb8 + **(long **)*in_RCX))();
  TVar3 = (TPZSpectralTransform<double>)B->fRef;
  this->super_TPZSpectralTransform<double> = TVar3;
  LOCK();
  paVar1 = (atomic_int *)((long)TVar3 + 8);
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  lVar4 = (B->fRef->fPointer->super_TPZBaseMatrix).fRow;
  if (0 < lVar4) {
    pTVar2 = A[1].fRef;
    lVar8 = 0;
    do {
      plVar5 = *(long **)this->super_TPZSpectralTransform<double>;
      plVar6 = *(long **)this->super_TPZSpectralTransform<double>;
      local_30 = (double)(**(code **)(*plVar6 + 0x120))(plVar6,lVar8,lVar8);
      local_30 = local_30 - (double)pTVar2;
      (**(code **)(*plVar5 + 0x118))(plVar5,lVar8,lVar8,&local_30);
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  return (TPZAutoPointer<TPZMatrix<double>_>)(TPZReference *)this;
}

Assistant:

TPZAutoPointer<TPZMatrix<TVar>>
TPZSTShiftOrigin<TVar>::CalcMatrix(TPZAutoPointer<TPZMatrix<TVar>>A, TPZAutoPointer<TPZMatrix<TVar>>B) const
{
  if (B->IsSymmetric()) B->Decompose_LDLt();
  else B->Decompose_LU();
  TPZAutoPointer<TPZMatrix<TVar>> shiftedMat = A;
  //b-1 * shiftedA will be computed at the arnoldi iteration
  const auto &shift = Shift();
  const auto nRows = A->Rows();
  for(int i = 0; i < nRows; i++) shiftedMat->PutVal(i,i,shiftedMat->GetVal(i,i)-shift);
  return shiftedMat;
}